

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_loopfilter.c
# Opt level: O2

void av1_loop_filter_init(AV1_COMMON *cm)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint8_t *puVar4;
  undefined4 uVar5;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 auVar6 [16];
  
  update_sharpness(&cm->lf_info,(cm->lf).sharpness_level);
  puVar4 = (cm->lf_info).lfthr[0].hev_thr;
  for (uVar2 = 0; uVar2 != 0x40; uVar2 = uVar2 + 1) {
    uVar1 = (uint)(uVar2 >> 4);
    uVar3 = uVar1 & 0xfffffff;
    uVar9 = (undefined1)(uVar3 >> 0x18);
    uVar8 = (undefined1)(uVar3 >> 0x10);
    uVar7 = (undefined1)(uVar3 >> 8);
    auVar6._4_4_ = (int)(CONCAT35(CONCAT21(CONCAT11(uVar9,uVar9),uVar8),CONCAT14(uVar8,uVar1)) >>
                        0x20);
    auVar6[3] = uVar7;
    auVar6[2] = uVar7;
    auVar6[0] = (undefined1)uVar3;
    auVar6[1] = auVar6[0];
    auVar6._8_8_ = 0;
    auVar6 = pshuflw(auVar6,auVar6,0);
    uVar5 = auVar6._0_4_;
    *(undefined4 *)puVar4 = uVar5;
    *(undefined4 *)(puVar4 + 4) = uVar5;
    *(undefined4 *)(puVar4 + 8) = uVar5;
    *(undefined4 *)(puVar4 + 0xc) = uVar5;
    puVar4 = puVar4 + 0x30;
  }
  return;
}

Assistant:

void av1_loop_filter_init(AV1_COMMON *cm) {
  assert(MB_MODE_COUNT == NELEMENTS(mode_lf_lut));
  loop_filter_info_n *lfi = &cm->lf_info;
  struct loopfilter *lf = &cm->lf;
  int lvl;

  // init limits for given sharpness
  update_sharpness(lfi, lf->sharpness_level);

  // init hev threshold const vectors
  for (lvl = 0; lvl <= MAX_LOOP_FILTER; lvl++)
    memset(lfi->lfthr[lvl].hev_thr, (lvl >> 4), SIMD_WIDTH);
}